

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O2

void RunAll2(string *f1)

{
  size_t sVar1;
  pointer pdVar2;
  CSR *this;
  Matrix *this_00;
  TriangularSolve *this_01;
  long lVar3;
  Matrix *pMVar4;
  long lVar5;
  ostream *poVar6;
  CSC *this_02;
  TriangularSolve *this_03;
  Matrix *this_04;
  int iVar7;
  pointer pdVar8;
  bool bVar9;
  double durationSym1;
  vector<double,_std::allocator<double>_> t2;
  vector<double,_std::allocator<double>_> t1;
  CSC *H;
  string local_278;
  string in_path_;
  ifstream fin;
  
  t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&in_path_,(string *)f1);
  std::ifstream::ifstream(&fin,(string *)&in_path_,_S_in);
  format::read_mtx_csc_real(&fin,&H,true);
  this = (CSR *)operator_new(0x30);
  CSR::CSR(this,(int)H->n,(int)H->m,(int)H->nnz,H->p,H->i,H->x);
  CSR::turntoCSR(this);
  this_00 = (Matrix *)operator_new(0x30);
  sVar1 = H->n;
  std::__cxx11::string::string((string *)&local_278,"vector:",(allocator *)&durationSym1);
  Matrix::Matrix(this_00,(int)sVar1,1,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  Matrix::Random(this_00);
  this_01 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(this_01,(int)H->n);
  iVar7 = 5;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    lVar3 = std::chrono::_V2::system_clock::now();
    pMVar4 = TriangularSolve::solve(this_01,this,this_00);
    lVar5 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar5 - lVar3) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&t1,&durationSym1);
    if (pMVar4 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar4);
    }
    operator_delete(pMVar4,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  poVar6 = std::operator<<((ostream *)&std::cout,"Solve(CSR)");
  std::operator<<(poVar6,",");
  pdVar2 = t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar8 = t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar8 != pdVar2; pdVar8 = pdVar8 + 1) {
    poVar6 = std::ostream::_M_insert<double>(*pdVar8);
    std::operator<<(poVar6," ,");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  this_02 = (CSC *)operator_new(0x30);
  CSC::CSC(this_02,(int)H->n,(int)H->m,(int)H->nnz,H->p,H->i,H->x);
  pMVar4 = CSC::cscMult(this_02,this_00);
  this_03 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(this_03,(int)H->n);
  iVar7 = 5;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    lVar3 = std::chrono::_V2::system_clock::now();
    this_04 = TriangularSolve::solve(this_03,this_02,this_00);
    lVar5 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar5 - lVar3) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&t2,&durationSym1);
    if (this_04 != (Matrix *)0x0) {
      Matrix::~Matrix(this_04);
    }
    operator_delete(this_04,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  poVar6 = std::operator<<((ostream *)&std::cout,"Solve(CSC)");
  std::operator<<(poVar6,",");
  pdVar2 = t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar8 = t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar8 != pdVar2; pdVar8 = pdVar8 + 1) {
    poVar6 = std::ostream::_M_insert<double>(*pdVar8);
    std::operator<<(poVar6," ,");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  format::CSC::~CSC(H);
  operator_delete(H,0x38);
  CSR::~CSR(this);
  operator_delete(this,0x30);
  Matrix::~Matrix(this_00);
  operator_delete(this_00,0x30);
  TriangularSolve::~TriangularSolve(this_01);
  operator_delete(this_01,4);
  CSC::~CSC(this_02);
  operator_delete(this_02,0x30);
  if (pMVar4 != (Matrix *)0x0) {
    Matrix::~Matrix(pMVar4);
  }
  operator_delete(pMVar4,0x30);
  TriangularSolve::~TriangularSolve(this_03);
  operator_delete(this_03,4);
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&in_path_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&t2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&t1.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void  RunAll2(string f1)
{
    vector<double> t1;
    vector<double> t2;
    //CSR
    std::string in_path_ = f1;
    std::ifstream fin(in_path_);
    format::CSC *H;
    read_mtx_csc_real(fin, H, true);

    //print of csc file
    CSR *ccf = new CSR(H->n, H->m, H->nnz, H->p, H->i, H->x);
    //ccf->triplet();

    //turn to csr
    // cout<<"CSR:"<<"\n";
    ccf->turntoCSR();
    // ccf->triplet();

    //csc file Solve
    Matrix *v = new Matrix(H->n,1,"vector:");
    v->Random();
    // v->print();
    TriangularSolve *rs2 = new TriangularSolve(H->n);
    //time
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
          Matrix *result2 = rs2->solve( ccf, v);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym1 = elapsed_seconds.count();
        t1.push_back(durationSym1);
        // cout << "execution time (CSR Solve):" << durationSym1 << "\n";
        //result2->print();
        delete result2;
    }
    sort(t1.begin(), t1.end());
    cout << "Solve(CSR)"<<",";
    for (auto x : t1)
        cout << x << " ,";
    cout<<"\n";

    // csr Solve,Test the equation(ccf*y=rhcr)
    //  Matrix *rs3 = ccf->csrMult(result2);
    //  rs3->print();
    //bool r2 = rs3->isequal(v);
    // cout<<"the result of Triangular solve is(CSR): "<<r2 <<"\n";

    //multiply of csc(file) and vector(file)
    //Matrix *mf = cf->turnToRegular();
    // mf->print();
    //Matrix *vf = cf->csrMult();
    //  vf->print();


    //CSC

    // std::string in_path_ = f1 ;
    //  std::ifstream fin(in_path_);
    //  format::CSC *H;
    //  read_mtx_csc_real(fin, H, true);

    //  csc print file

    CSC *cc = new CSC(H->n, H->m, H->nnz, H->p, H->i, H->x);
    // cc->Triplet();
    Matrix *ccr = cc->cscMult(v);

    // ccr->print();

    //csc Solve
    TriangularSolve *ccs = new TriangularSolve(H->n);
    //time
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
          Matrix *result3 = ccs->solve(cc,v);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym2 = elapsed_seconds.count();
        t2.push_back(durationSym2);
        // result3->print();
        delete result3;
    }
    sort(t2.begin(), t2.end());
    cout << "Solve(CSC)"<<",";
    for (auto x : t2)
        cout << x << " ,";
    cout<<"\n";

    //PRINT All
    //cout<<"csr"<<","<<"csc"<<","<<"\n";
    // cout << durationSym1<<"," << durationSym2 << "\n";
    //cout<<"csc (solve):"<<"\n";
    // cout<<"print mcc again";


    //csc Solve,Test
    // Matrix *mcc2 = cc->cscMult(result3);
    //  mcc2->print();
    //  bool r3 = v->isequal(mcc2);
    // cout<<"the result of testing Triangular solve  (CSC) is: "<<r2 <<"\n";

    delete H;
    delete ccf;
    delete v;
    delete rs2;
    // delete result2;
    // delete rs3;
    //CSC
    delete cc;
    delete ccr;
    delete ccs;
    // delete result3;
    //  delete mcc2;


}